

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.cpp
# Opt level: O1

void __thiscall sf2cute::RIFF::Write(RIFF *this,ostream *out)

{
  pointer pcVar1;
  pointer puVar2;
  RIFFChunkInterface *pRVar3;
  int iVar4;
  undefined4 extraout_var;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_> *chunk;
  pointer puVar5;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
  *chunk_1;
  long lVar6;
  size_type size;
  string local_50;
  
  lVar6 = *(long *)(*(long *)out + -0x18);
  *(undefined4 *)(out + lVar6 + 0x1c) = 5;
  std::ios::clear((int)out + (int)lVar6);
  pcVar1 = (this->name_)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->name_)._M_string_length);
  puVar5 = (this->chunks_).
           super__Vector_base<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->chunks_).
           super__Vector_base<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 == puVar2) {
    size = 4;
  }
  else {
    lVar6 = 0;
    do {
      iVar4 = (*((puVar5->_M_t).
                 super___uniq_ptr_impl<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_sf2cute::RIFFChunkInterface_*,_std::default_delete<sf2cute::RIFFChunkInterface>_>
                 .super__Head_base<0UL,_sf2cute::RIFFChunkInterface_*,_false>._M_head_impl)->
                _vptr_RIFFChunkInterface[3])();
      lVar6 = lVar6 + CONCAT44(extraout_var,iVar4);
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar2);
    size = lVar6 + 4;
  }
  WriteHeader(out,&local_50,size);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  puVar2 = (this->chunks_).
           super__Vector_base<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (this->chunks_).
                super__Vector_base<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    pRVar3 = (puVar5->_M_t).
             super___uniq_ptr_impl<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_sf2cute::RIFFChunkInterface_*,_std::default_delete<sf2cute::RIFFChunkInterface>_>
             .super__Head_base<0UL,_sf2cute::RIFFChunkInterface_*,_false>._M_head_impl;
    (*pRVar3->_vptr_RIFFChunkInterface[4])(pRVar3,out);
  }
  return;
}

Assistant:

void RIFF::Write(std::ostream & out) const {
  // Save exception bits of output stream.
  const std::ios_base::iostate old_exception_bits = out.exceptions();
  // Set exception bits to get output error as an exception.
  out.exceptions(std::ios::badbit | std::ios::failbit);

  try {
    // Write the RIFF header.
    WriteHeader(out, name(), size() - 8);

    // Write each chunks.
    for (const auto & chunk : chunks_) {
      chunk->Write(out);
    }
  }
  catch (const std::exception &) {
    // Recover exception bits of output stream.
    out.exceptions(old_exception_bits);

    // Rethrow the exception.
    throw;
  }
}